

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<double> * __thiscall Imath_3_2::Matrix44<double>::transpose(Matrix44<double> *this)

{
  Matrix44<double> tmp;
  Matrix44<double> local_88;
  
  local_88.x[0][1] = this->x[1][0];
  local_88.x[0][2] = this->x[2][0];
  local_88.x[0][3] = this->x[3][0];
  local_88.x[0][0] = this->x[0][0];
  local_88.x[1][0] = this->x[0][1];
  local_88.x[1][1] = this->x[1][1];
  local_88.x[1][2] = this->x[2][1];
  local_88.x[1][3] = this->x[3][1];
  local_88.x[2][0] = this->x[0][2];
  local_88.x[2][1] = this->x[1][2];
  local_88.x[2][2] = this->x[2][2];
  local_88.x[2][3] = this->x[3][2];
  local_88.x[3][0] = this->x[0][3];
  local_88.x[3][1] = this->x[1][3];
  local_88.x[3][2] = this->x[2][3];
  local_88.x[3][3] = this->x[3][3];
  operator=(this,&local_88);
  return this;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::transpose () IMATH_NOEXCEPT
{
    Matrix44 tmp (
        x[0][0],
        x[1][0],
        x[2][0],
        x[3][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[3][1],
        x[0][2],
        x[1][2],
        x[2][2],
        x[3][2],
        x[0][3],
        x[1][3],
        x[2][3],
        x[3][3]);
    *this = tmp;
    return *this;
}